

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void box3_subdivide(box3_t bbox,box3_t *out)

{
  box3_t bVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_stack_00000008;
  float local_88 [2];
  vec3_t ps [2];
  float afStack_68 [2];
  vec3_t vs [8];
  
  bVar1 = bbox;
  ps[0].x = bbox.min.x;
  ps[0].y = bbox.min.y;
  ps[0].z = bbox.min.z;
  ps[1].x = bbox.max.x;
  lVar2 = 8;
  do {
    fVar3 = ps[*(int *)((long)&cube_table[0].x + lVar2)].x;
    *(ulong *)((long)&ps[1].y + lVar2) =
         CONCAT44(ps[(long)*(int *)(&UNK_0010708c + lVar2) + -1].z,
                  local_88[(long)*(int *)(&UNK_00107088 + lVar2) * 3]);
    *(float *)((long)afStack_68 + lVar2) = fVar3;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x68);
  fVar3 = (bVar1.min.y + (float)in_stack_00000008) * 0.5;
  fVar4 = (bVar1.min.z + (float)((ulong)in_stack_00000008 >> 0x20)) * 0.5;
  fVar5 = (bbox.max.x + bbox.min.x) * 0.5;
  lVar2 = 0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)afStack_68 + lVar2);
    fVar7 = *(float *)((long)&vs[0].x + lVar2);
    fVar8 = fVar5;
    if (fVar7 <= fVar5) {
      fVar8 = fVar7;
    }
    fVar9 = fVar5;
    if (fVar5 <= fVar7) {
      fVar9 = fVar7;
    }
    fVar7 = fVar8;
    if (fVar9 <= fVar8) {
      fVar7 = fVar9;
    }
    auVar10._4_4_ = fVar4;
    auVar10._0_4_ = fVar3;
    auVar10._8_8_ = 0;
    auVar10 = minps(auVar10,auVar6);
    auVar11._4_4_ = fVar4;
    auVar11._0_4_ = fVar3;
    auVar11._8_8_ = 0;
    auVar11 = maxps(auVar11,auVar6);
    auVar6 = minps(auVar10,auVar11);
    auVar10 = maxps(auVar10,auVar11);
    if (fVar8 <= fVar9) {
      fVar8 = fVar9;
    }
    *(long *)((long)&(out->min).x + lVar2 * 2) = auVar6._0_8_;
    *(float *)((long)&(out->min).z + lVar2 * 2) = fVar7;
    *(long *)((long)&(out->max).x + lVar2 * 2) = auVar10._0_8_;
    *(float *)((long)&(out->max).z + lVar2 * 2) = fVar8;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x60);
  return;
}

Assistant:

void
box3_subdivide(box3_t bbox, box3_t out[3]) {
    vec3_t  ps[2] = { bbox.min, bbox.max };

    vec3_t  vs[8];
    for( uint32_t i = 0; i < 8; ++i ) {
        vs[i] = vec3(ps[cube_table[i].x].x, ps[cube_table[i].y].y, ps[cube_table[i].z].z);
    }

    vec3_t  center = box3_center(bbox);

    for( uint32_t i = 0; i < 8; ++i ) {
        out[i] = box3(vec3_min(center, vs[i]), vec3_max(center, vs[i]));
    }
}